

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Regexp * re2::Regexp::NewCharClass(CharClass *cc,ParseFlags flags)

{
  Regexp *pRVar1;
  
  pRVar1 = (Regexp *)operator_new(0x28);
  pRVar1->op_ = '\x14';
  pRVar1->simple_ = '\0';
  pRVar1->parse_flags_ = (uint16)flags;
  pRVar1->ref_ = 1;
  *(undefined2 *)((long)&pRVar1->field_7 + 0xe) = 0;
  *(undefined8 *)((long)&pRVar1->down_ + 6) = 0;
  *(undefined8 *)((long)&(pRVar1->field_7).field_3.cc_ + 6) = 0;
  *(undefined8 *)&pRVar1->nsub_ = 0;
  *(undefined8 *)((long)&pRVar1->field_5 + 6) = 0;
  (pRVar1->field_7).field_3.cc_ = cc;
  return pRVar1;
}

Assistant:

Regexp* Regexp::NewCharClass(CharClass* cc, ParseFlags flags) {
  Regexp* re = new Regexp(kRegexpCharClass, flags);
  re->cc_ = cc;
  return re;
}